

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_field_info.h
# Opt level: O3

void __thiscall
google::protobuf::internal::MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
          (MapDynamicFieldInfo<google::protobuf::Message> *this,Reflection *r,Message *m,
          FieldDescriptor *f,FieldDescriptor *key_f,FieldDescriptor *val_f,MapFieldBase *map_field)

{
  bool bVar1;
  internal local_20 [16];
  
  this->reflection = r;
  this->message = m;
  this->field = f;
  this->key = key_f;
  this->value = val_f;
  this->const_map_field = map_field;
  if (f->type_ == '\v') {
    bVar1 = FieldDescriptor::is_map_message_type(f);
    if (!bVar1) goto LAB_00206987;
    if (key_f != (FieldDescriptor *)0x0) {
      if (val_f != (FieldDescriptor *)0x0) {
        return;
      }
      goto LAB_0020699b;
    }
  }
  else {
LAB_00206987:
    internal::MapDynamicFieldInfo(local_20);
  }
  internal::MapDynamicFieldInfo(local_20);
LAB_0020699b:
  internal::MapDynamicFieldInfo(local_20);
}

Assistant:

constexpr MapDynamicFieldInfo(const Reflection* r, MessageT& m,
                                const FieldDescriptor* f,
                                const FieldDescriptor* key_f,
                                const FieldDescriptor* val_f,
                                const MapFieldBase& map_field)
      : reflection(r),
        message(m),
        field(f),
        key(key_f),
        value(val_f),
        const_map_field(map_field) {
    ABSL_DCHECK(f->is_map());
    ABSL_DCHECK_NE(key_f, nullptr);
    ABSL_DCHECK_NE(val_f, nullptr);
  }